

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

int64_t __thiscall llvm::APInt::getSExtValue(APInt *this)

{
  bool bVar1;
  uint uVar2;
  APInt *this_local;
  
  bVar1 = isSingleWord(this);
  if (bVar1) {
    this_local = (APInt *)SignExtend64((this->U).VAL,this->BitWidth);
  }
  else {
    uVar2 = getMinSignedBits(this);
    if (0x40 < uVar2) {
      __assert_fail("getMinSignedBits() <= 64 && \"Too many bits for int64_t\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                    ,0x623,"int64_t llvm::APInt::getSExtValue() const");
    }
    this_local = (APInt *)*(this->U).pVal;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t getSExtValue() const {
    if (isSingleWord())
      return SignExtend64(U.VAL, BitWidth);
    assert(getMinSignedBits() <= 64 && "Too many bits for int64_t");
    return int64_t(U.pVal[0]);
  }